

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O2

void Cec_ManPatComputePattern1_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vPat)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  Gia_Obj_t *pObj_00;
  
  while( true ) {
    pObj_00 = pObj;
    iVar1 = Gia_ObjIsTravIdCurrent(p,pObj_00);
    if (iVar1 != 0) {
      return;
    }
    Gia_ObjSetTravIdCurrent(p,pObj_00);
    uVar3 = *(ulong *)pObj_00;
    uVar2 = (uint)uVar3;
    if ((~uVar2 & 0x9fffffff) == 0) break;
    if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecPat.c"
                    ,0xb4,
                    "void Cec_ManPatComputePattern1_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    pObj = pObj_00 + -(ulong)(uVar2 & 0x1fffffff);
    if ((uVar3 & 0x4000000000000000) == 0) {
      if (((((uint)(uVar3 >> 0x1d) & 7 ^ (uint)((ulong)*(undefined8 *)pObj >> 0x3e)) & 1) != 0) &&
         (uVar2 = (uint)(uVar3 >> 0x20), uVar3 = (ulong)(uVar2 & 0x1fffffff),
         pObj = pObj_00 + -uVar3,
         ((uVar2 >> 0x1d ^ (uint)((ulong)*(undefined8 *)(pObj_00 + -uVar3) >> 0x3e)) & 1) != 0)) {
        __assert_fail("(Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 || (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj)) == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecPat.c"
                      ,0xbd,
                      "void Cec_ManPatComputePattern1_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
    }
    else {
      Cec_ManPatComputePattern1_rec(p,pObj,vPat);
      pObj = pObj_00 + -(ulong)(*(uint *)&pObj_00->field_0x4 & 0x1fffffff);
    }
  }
  iVar1 = Gia_ObjCioId(pObj_00);
  Vec_IntPush(vPat,(uint)(((undefined1  [12])*pObj_00 & (undefined1  [12])0x4000000000000000) ==
                         (undefined1  [12])0x0) + iVar1 * 2);
  return;
}

Assistant:

void Cec_ManPatComputePattern1_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vPat )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vPat, Abc_Var2Lit( Gia_ObjCioId(pObj), pObj->fMark1==0 ) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    if ( pObj->fMark1 == 1 )
    {
        Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin0(pObj), vPat );
        Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin1(pObj), vPat );
    }
    else
    {
        assert( (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 ||
                (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj)) == 0 );
        if ( (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 )
            Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin0(pObj), vPat );
        else
            Cec_ManPatComputePattern1_rec( p, Gia_ObjFanin1(pObj), vPat );
    }
}